

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_optimize(void)

{
  long lVar1;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  uint32_t subleaf;
  uint32_t leaf;
  
  lVar1 = cpuid_Version_info(1);
  if ((*(uint *)(lVar1 + 0xc) >> 0x13 & 1) != 0) {
    use_optimized_transform = 1;
  }
  return;
}

Assistant:

void sha256_optimize(void)
{
#if defined(__x86_64__) || defined(__amd64__)
	uint32_t leaf = 1, subleaf = 0;
	uint32_t eax = 0, ebx = 0, ecx = 0, edx = 0;
#ifdef __GNUC__
	__cpuid_count(leaf, subleaf, eax, ebx, ecx, edx);
#else
	__asm__ ("cpuid" : "=a"(eax), "=b"(ebx), "=c"(ecx), "=d"(edx) : "0"(leaf), "2"(subleaf));
#endif
	if ((ecx >> 19) & 1) {
		use_optimized_transform = 1; /* SSE4 is available */
	}
#endif
}